

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O1

BitArray * ZXing::Aztec::HighLevelEncoder::Encode(BitArray *__return_storage_ptr__,string *text)

{
  byte bVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  int iVar8;
  Token *symbol;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  EncodingState minState;
  EncodingState stateNoBinary;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> states;
  undefined1 local_128 [32];
  int local_108;
  EncodingState *local_100;
  undefined1 local_f8 [32];
  int local_d8;
  BitArray *local_c8;
  ulong local_c0;
  undefined1 local_b8 [24];
  _List_node_base *p_Stack_a0;
  int local_98;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_90;
  ulong local_78;
  string *local_70;
  long local_68;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_60;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_48;
  
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node._M_size = 0;
  local_c8 = __return_storage_ptr__;
  local_60._M_impl._M_node.super__List_node_base._M_prev =
       local_60._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = (_List_node_base *)operator_new(0x38);
  p_Var6[2]._M_next = (_List_node_base *)0x0;
  p_Var6[2]._M_prev = (_List_node_base *)0x0;
  p_Var6[1]._M_next = (_List_node_base *)0x0;
  p_Var6[1]._M_prev = (_List_node_base *)0x0;
  *(undefined4 *)&p_Var6[3]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  local_60._M_impl._M_node._M_size = local_60._M_impl._M_node._M_size + 1;
  iVar10 = (int)text->_M_string_length;
  if (0 < iVar10) {
    uVar9 = 0;
    local_70 = text;
    do {
      local_68 = (long)(int)uVar9;
      local_100 = (EncodingState *)(local_68 + 1);
      cVar5 = '\0';
      if ((int)local_100 < iVar10) {
        cVar5 = (text->_M_dataplus)._M_p
                [(long)&(local_100->tokens).
                        super__Vector_base<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>
                ];
      }
      bVar1 = (text->_M_dataplus)._M_p[local_68];
      iVar10 = 0;
      if (bVar1 < 0x2e) {
        if (bVar1 == 0xd) {
          iVar10 = (uint)(cVar5 == '\n') * 2;
        }
        else {
          iVar10 = 0;
          if (bVar1 == 0x2c) {
            iVar10 = (uint)(cVar5 == ' ') << 2;
          }
        }
      }
      else if (bVar1 == 0x2e) {
        iVar10 = (uint)(cVar5 == ' ') * 3;
      }
      else if (bVar1 == 0x3a) {
        iVar10 = (uint)(cVar5 == ' ') * 5;
      }
      local_c0 = uVar9;
      if (iVar10 == 0) {
        local_f8._16_8_ = (_List_node_base *)0x0;
        local_f8._0_8_ = (_List_node_base *)local_f8;
        local_f8._8_8_ = (_List_node_base *)local_f8;
        for (p_Var6 = local_60._M_impl._M_node.super__List_node_base._M_next;
            p_Var6 != (_List_node_base *)&local_60; p_Var6 = p_Var6->_M_next) {
          local_100 = (EncodingState *)(p_Var6 + 1);
          uVar9 = (ulong)(byte)(text->_M_dataplus)._M_p[local_68];
          cVar5 = *(char *)(uVar9 + (long)*(int *)&p_Var6[2]._M_prev * 0x100 + CHAR_MAP);
          local_b8._16_8_ = (_List_node_base *)0x0;
          p_Stack_a0 = (_List_node_base *)0x0;
          local_b8._0_8_ = (_List_node_base *)0x0;
          local_b8._8_8_ = (_List_node_base *)0x0;
          local_98 = 0;
          bVar12 = true;
          uVar11 = 0;
          local_78 = uVar9;
          do {
            cVar2 = *(char *)(CHAR_MAP + uVar9);
            if ('\0' < cVar2) {
              if (bVar12) {
                EndBinaryShift((EncodingState *)local_128,local_100,(int)local_c0);
                uVar4 = local_b8._16_8_;
                uVar3 = local_b8._0_8_;
                local_b8._0_8_ = local_128._0_8_;
                local_b8._8_8_ = local_128._8_8_;
                local_b8._16_8_ = local_128._16_8_;
                local_128._0_8_ = (_List_node_base *)0x0;
                local_128._8_8_ = (_List_node_base *)0x0;
                local_128._16_8_ = (_List_node_base *)0x0;
                if ((_List_node_base *)uVar3 != (_List_node_base *)0x0) {
                  operator_delete((void *)uVar3,uVar4 - uVar3);
                }
                local_98 = local_108;
                p_Stack_a0 = (_List_node_base *)local_128._24_8_;
                if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                }
                bVar12 = false;
              }
              if (((cVar5 < '\x01') || (uVar11 == 2)) || (uVar11 == *(uint *)&p_Var6[2]._M_prev)) {
                LatchAndAppend((EncodingState *)local_128,(EncodingState *)local_b8,(int)uVar11,
                               (int)cVar2);
                p_Var7 = (_List_node_base *)operator_new(0x38);
                p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
                p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
                p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
                local_128._0_8_ = (_List_node_base *)0x0;
                local_128._8_8_ = (_List_node_base *)0x0;
                local_128._16_8_ = (_List_node_base *)0x0;
                *(int *)&p_Var7[3]._M_next = local_108;
                p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
                std::__detail::_List_node_base::_M_hook(p_Var7);
                local_f8._16_8_ = (long)(_List_node_base **)local_f8._16_8_ + 1;
                if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                }
              }
              if (cVar5 < '\x01') {
                if (-1 < *(char *)(uVar11 + (long)*(int *)&p_Var6[2]._M_prev * 6 + SHIFT_TABLE)) {
                  ShiftAndAppend((EncodingState *)local_128,(EncodingState *)local_b8,(int)uVar11,
                                 (int)cVar2);
                  p_Var7 = (_List_node_base *)operator_new(0x38);
                  p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
                  p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
                  p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
                  local_128._0_8_ = (_List_node_base *)0x0;
                  local_128._8_8_ = (_List_node_base *)0x0;
                  local_128._16_8_ = (_List_node_base *)0x0;
                  *(int *)&p_Var7[3]._M_next = local_108;
                  p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
                  std::__detail::_List_node_base::_M_hook(p_Var7);
                  local_f8._16_8_ = (long)(_List_node_base **)local_f8._16_8_ + 1;
                  if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                  }
                }
              }
            }
            text = local_70;
            uVar11 = uVar11 + 1;
            uVar9 = uVar9 + 0x100;
          } while (uVar11 != 5);
          if (*(int *)((long)&p_Var6[2]._M_prev + 4) < 1) {
            if (*(char *)(local_78 + (long)*(int *)&p_Var6[2]._M_prev * 0x100 + CHAR_MAP) == '\0')
            goto LAB_0014bef1;
          }
          else {
LAB_0014bef1:
            AddBinaryShiftChar((EncodingState *)local_128,local_100,(int)local_c0);
            p_Var7 = (_List_node_base *)operator_new(0x38);
            p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
            p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
            p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
            local_128._0_8_ = (_List_node_base *)0x0;
            local_128._8_8_ = (_List_node_base *)0x0;
            local_128._16_8_ = (_List_node_base *)0x0;
            *(int *)&p_Var7[3]._M_next = local_108;
            p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            local_f8._16_8_ = (long)(_List_node_base **)local_f8._16_8_ + 1;
            if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
          }
          if ((_List_node_base *)local_b8._0_8_ != (_List_node_base *)0x0) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
          }
        }
        if ((ulong)local_f8._16_8_ < (_List_node_base *)0x2) {
          std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::list
                    ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)&local_90,
                     (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)local_f8);
        }
        else {
          SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)&local_90,
                         (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)local_f8);
        }
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                  *)local_f8);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_move_assign((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_60,&local_90);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_90);
        iVar8 = (int)local_c0;
      }
      else {
        local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
        local_90._M_impl._M_node._M_size = 0;
        local_90._M_impl._M_node.super__List_node_base._M_prev =
             local_90._M_impl._M_node.super__List_node_base._M_next;
        if (local_60._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_60)
        {
          local_78 = CONCAT44(local_78._4_4_,0x10 - iVar10);
          p_Var6 = local_60._M_impl._M_node.super__List_node_base._M_next;
          do {
            EndBinaryShift((EncodingState *)local_b8,(EncodingState *)(p_Var6 + 1),(int)local_c0);
            LatchAndAppend((EncodingState *)local_128,(EncodingState *)local_b8,4,iVar10);
            p_Var7 = (_List_node_base *)operator_new(0x38);
            p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
            p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
            p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
            local_128._0_8_ = (_List_node_base *)0x0;
            local_128._8_8_ = (_List_node_base *)0x0;
            local_128._16_8_ = (_List_node_base *)0x0;
            *(int *)&p_Var7[3]._M_next = local_108;
            p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
            if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
            if (*(int *)&p_Var6[2]._M_prev != 4) {
              ShiftAndAppend((EncodingState *)local_128,(EncodingState *)local_b8,4,iVar10);
              p_Var7 = (_List_node_base *)operator_new(0x38);
              p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
              p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
              p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
              local_128._0_8_ = (_List_node_base *)0x0;
              local_128._8_8_ = (_List_node_base *)0x0;
              local_128._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var7[3]._M_next = local_108;
              p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var7);
              local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
            }
            if (iVar10 - 3U < 2) {
              LatchAndAppend((EncodingState *)local_128,(EncodingState *)local_b8,2,(int)local_78);
              LatchAndAppend((EncodingState *)local_f8,(EncodingState *)local_128,2,1);
              p_Var7 = (_List_node_base *)operator_new(0x38);
              p_Var7[1]._M_next = (_List_node_base *)local_f8._0_8_;
              p_Var7[1]._M_prev = (_List_node_base *)local_f8._8_8_;
              p_Var7[2]._M_next = (_List_node_base *)local_f8._16_8_;
              local_f8._0_8_ = (_List_node_base *)0x0;
              local_f8._8_8_ = (_List_node_base *)0x0;
              local_f8._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var7[3]._M_next = local_d8;
              p_Var7[2]._M_prev = (_List_node_base *)local_f8._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var7);
              local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_f8._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
              }
              if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
            }
            if (0 < *(int *)((long)&p_Var6[2]._M_prev + 4)) {
              AddBinaryShiftChar((EncodingState *)local_f8,(EncodingState *)(p_Var6 + 1),
                                 (int)local_c0);
              AddBinaryShiftChar((EncodingState *)local_128,(EncodingState *)local_f8,(int)local_100
                                );
              p_Var7 = (_List_node_base *)operator_new(0x38);
              p_Var7[1]._M_next = (_List_node_base *)local_128._0_8_;
              p_Var7[1]._M_prev = (_List_node_base *)local_128._8_8_;
              p_Var7[2]._M_next = (_List_node_base *)local_128._16_8_;
              local_128._0_8_ = (_List_node_base *)0x0;
              local_128._8_8_ = (_List_node_base *)0x0;
              local_128._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var7[3]._M_next = local_108;
              p_Var7[2]._M_prev = (_List_node_base *)local_128._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var7);
              local_90._M_impl._M_node._M_size = local_90._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
              if ((_List_node_base *)local_f8._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
              }
            }
            if ((_List_node_base *)local_b8._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
            }
            p_Var6 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          } while (p_Var6 != (_List_node_base *)&local_60);
        }
        SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_48,
                       (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_90);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_90);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_move_assign((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_60,&local_48);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_48);
        iVar8 = (int)local_100;
        text = local_70;
      }
      uVar9 = (ulong)(iVar8 + 1U);
      iVar10 = (int)text->_M_string_length;
    } while ((int)(iVar8 + 1U) < iVar10);
  }
  p_Var6 = local_60._M_impl._M_node.super__List_node_base._M_next;
  if ((local_60._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_60) &&
     (p_Var7 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                  *)&(local_60._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next, p_Var7 != (_List_node_base *)&local_60)) {
    do {
      if (*(int *)&(((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)(p_Var7 + 3))->
                   super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                   )._M_impl._M_node.super__List_node_base._M_next <
          *(int *)&(((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)&p_Var6[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)&local_60);
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)local_128,
             (vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)(p_Var6 + 1));
  local_108 = *(int *)&(((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)&p_Var6[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  local_128._24_8_ = p_Var6[2]._M_prev;
  EndBinaryShift((EncodingState *)local_b8,(EncodingState *)local_128,(int)text->_M_string_length);
  uVar3 = local_b8._8_8_;
  (local_c8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_c8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_c8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var6 = (_List_node_base *)local_b8._0_8_; p_Var6 != (_List_node_base *)uVar3;
      p_Var6 = (_List_node_base *)((long)&p_Var6->_M_next + 4)) {
    Token::appendTo((Token *)p_Var6,local_c8,text);
  }
  if ((_List_node_base *)local_b8._0_8_ != (_List_node_base *)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  if ((_List_node_base *)local_128._0_8_ != (_List_node_base *)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::__cxx11::
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::_M_clear
            (&local_60);
  return local_c8;
}

Assistant:

BitArray
HighLevelEncoder::Encode(const std::string& text)
{
	std::list<EncodingState> states;
	states.push_back(EncodingState{ std::vector<Token>(), MODE_UPPER, 0, 0 });
	for (int index = 0; index < Size(text); index++) {
		int pairCode;
		int nextChar = index + 1 < Size(text) ? text[index + 1] : 0;
		switch (text[index]) {
		case '\r': pairCode = nextChar == '\n' ? 2 : 0; break;
		case '.': pairCode = nextChar == ' ' ? 3 : 0; break;
		case ',': pairCode = nextChar == ' ' ? 4 : 0; break;
		case ':': pairCode = nextChar == ' ' ? 5 : 0; break;
		default: pairCode = 0;
		}
		if (pairCode > 0) {
			// We have one of the four special PUNCT pairs.  Treat them specially.
			// Get a new set of states for the two new characters.
			states = UpdateStateListForPair(states, index, pairCode);
			index++;
		} else {
			// Get a new set of states for the new character.
			states = UpdateStateListForChar(states, text, index);
		}
	}
	// We are left with a set of states.  Find the shortest one.
	EncodingState minState = *std::min_element(states.begin(), states.end(), [](const EncodingState& a, const EncodingState& b) { return a.bitCount < b.bitCount; });
	// Convert it to a bit array, and return.
	return ToBitArray(minState, text);
}